

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

bool __thiscall
QTableWidget::dropMimeData(QTableWidget *this,int row,int column,QMimeData *data,DropAction action)

{
  undefined1 uVar1;
  DropIndicatorPosition DVar2;
  QAbstractItemModel *pQVar3;
  QTableModel *pQVar4;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0xffffffffffffffff;
  local_40 = 0;
  uStack_38 = 0;
  DVar2 = QAbstractItemView::dropIndicatorPosition((QAbstractItemView *)this);
  if (DVar2 == OnItem) {
    pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
    (**(code **)(*(long *)pQVar3 + 0x60))(&local_48,pQVar3,row,column);
    row = 0xffffffff;
    column = row;
  }
  pQVar4 = QTableWidgetPrivate::tableModel
                     (*(QTableWidgetPrivate **)
                       &(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
                        super_QFrame.super_QWidget.field_0x8);
  uVar1 = QAbstractTableModel::dropMimeData
                    ((QMimeData *)pQVar4,(DropAction)data,action,row,
                     (QModelIndex *)(ulong)(uint)column);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableWidget::dropMimeData(int row, int column, const QMimeData *data, Qt::DropAction action)
{
    QModelIndex idx;
#if QT_CONFIG(draganddrop)
    if (dropIndicatorPosition() == QAbstractItemView::OnItem) {
        // QAbstractTableModel::dropMimeData will overwrite on the index if row == -1 and column == -1
        idx = model()->index(row, column);
        row = -1;
        column = -1;
    }
#endif
    return d_func()->tableModel()->QAbstractTableModel::dropMimeData(data, action , row, column, idx);
}